

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_connect_op.hpp
# Opt level: O1

status asio::detail::reactive_socket_connect_op_base::do_perform(reactor_op *base)

{
  bool bVar1;
  
  bVar1 = socket_ops::non_blocking_connect
                    (*(socket_type *)&base[1].super_operation.next_,&base->ec_);
  return (status)bVar1;
}

Assistant:

static status do_perform(reactor_op* base)
  {
    ASIO_ASSUME(base != 0);
    reactive_socket_connect_op_base* o(
        static_cast<reactive_socket_connect_op_base*>(base));

    status result = socket_ops::non_blocking_connect(
        o->socket_, o->ec_) ? done : not_done;

    ASIO_HANDLER_REACTOR_OPERATION((*o, "non_blocking_connect", o->ec_));

    return result;
  }